

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O1

Var Js::WebAssemblyModule::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  WebAssemblyModule *pWVar7;
  int in_stack_00000010;
  undefined1 local_58 [8];
  WebAssemblySource src;
  undefined1 auStack_30 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x37,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d9dc9b;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_30 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)auStack_30,(CallInfo *)&args.super_Arguments.Values);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)auStack_30 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x3a,"(args.HasArg())","Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00d9dc9b:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pvVar6 = CallInfo::GetNewTarget
                     ((uint)auStack_30._0_4_ >> 0x18,(Var *)args.super_Arguments.Info,
                      auStack_30._0_4_ & 0xffffff);
  src.sourceInfo = (Utf8SourceInfo *)auStack_30;
  JavascriptOperators::GetAndAssertIsConstructorSuperCall((Arguments *)&src.sourceInfo);
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    if (pvVar6 != (Var)0x0) {
      BVar4 = JavascriptOperators::IsUndefinedObject(pvVar6);
      if (BVar4 != 0) goto LAB_00d9dc87;
    }
    if (((ulong)auStack_30 & 0xfffffe) != 0) {
      pvVar6 = Arguments::operator[]((Arguments *)auStack_30,1);
      WebAssemblySource::WebAssemblySource((WebAssemblySource *)local_58,pvVar6,true,pSVar1);
      pWVar7 = CreateModule(pSVar1,(WebAssemblySource *)local_58);
      return pWVar7;
    }
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e4a6,(PCWSTR)0x0);
  }
LAB_00d9dc87:
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ea00,L"WebAssembly.Module");
}

Assistant:

Var
WebAssemblyModule::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    AssertMsg(args.HasArg(), "Should always have implicit 'this'");

    Var newTarget = args.GetNewTarget();
    JavascriptOperators::GetAndAssertIsConstructorSuperCall(args);

    if (!(callInfo.Flags & CallFlags_New) || (newTarget && JavascriptOperators::IsUndefinedObject(newTarget)))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_ClassConstructorCannotBeCalledWithoutNew, _u("WebAssembly.Module"));
    }

    if (args.Info.Count < 2)
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedBufferSource);
    }

    WebAssemblySource src(args[1], true, scriptContext);
    return CreateModule(scriptContext, &src);
}